

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::deinit
          (GeometryShaderRenderTest *this)

{
  Surface *pSVar1;
  ReferenceContextBuffers *this_00;
  GeometryShaderRenderTest *this_local;
  
  pSVar1 = this->m_glResult;
  if (pSVar1 != (Surface *)0x0) {
    tcu::Surface::~Surface(pSVar1);
    operator_delete(pSVar1,0x18);
  }
  pSVar1 = this->m_refResult;
  if (pSVar1 != (Surface *)0x0) {
    tcu::Surface::~Surface(pSVar1);
    operator_delete(pSVar1,0x18);
  }
  this->m_glResult = (Surface *)0x0;
  this->m_refResult = (Surface *)0x0;
  if (this->m_refContext != (ReferenceContext *)0x0) {
    (*(this->m_refContext->super_Context)._vptr_Context[1])();
  }
  if (this->m_glContext != (Context *)0x0) {
    (*this->m_glContext->_vptr_Context[1])();
  }
  this_00 = this->m_refBuffers;
  if (this_00 != (ReferenceContextBuffers *)0x0) {
    sglr::ReferenceContextBuffers::~ReferenceContextBuffers(this_00);
    operator_delete(this_00,0x78);
  }
  this->m_refBuffers = (ReferenceContextBuffers *)0x0;
  this->m_refContext = (ReferenceContext *)0x0;
  this->m_glContext = (Context *)0x0;
  return;
}

Assistant:

void GeometryShaderRenderTest::deinit (void)
{
	delete m_glResult;
	delete m_refResult;

	m_glResult = DE_NULL;
	m_refResult = DE_NULL;

	delete m_refContext;
	delete m_glContext;
	delete m_refBuffers;

	m_refBuffers = DE_NULL;
	m_refContext = DE_NULL;
	m_glContext = DE_NULL;
}